

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void * __thiscall ON_FixedSizePool::ElementFromId(ON_FixedSizePool *this,size_t id_offset,uint id)

{
  uint uVar1;
  uint uVar2;
  ulong count_00;
  void *pvVar3;
  size_t count;
  uint i1;
  uint i0;
  char *next_block;
  char *block_end;
  char *block;
  uint id_local;
  size_t id_offset_local;
  ON_FixedSizePool *this_local;
  
  if (id_offset < 8) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x394,"","id_offset is too small.");
  }
  else if (this->m_sizeof_element < id_offset + 4) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x39a,"","id_offset is too large.");
  }
  else {
    block_end = (char *)this->m_first_block;
    while (block_end != (char *)0x0) {
      if (block_end == (char *)this->m_al_block) {
        _i1 = (char *)0x0;
        next_block = (char *)this->m_al_element_array;
      }
      else {
        _i1 = *(char **)block_end;
        next_block = *(char **)(block_end + 8);
      }
      block_end = block_end + 0x10;
      uVar1 = *(uint *)(next_block + -(this->m_sizeof_element - id_offset));
      if (id <= uVar1) {
        if (id == uVar1) {
          return next_block + -this->m_sizeof_element;
        }
        uVar2 = *(uint *)(block_end + id_offset);
        if (uVar2 <= id) {
          if (id == uVar2) {
            return block_end;
          }
          count_00 = (ulong)((long)next_block - (long)block_end) / this->m_sizeof_element;
          if ((uVar1 - uVar2) + 1 != count_00) {
            pvVar3 = ON_BinarySearchArrayForUnsingedInt
                               (id,block_end,count_00,this->m_sizeof_element,id_offset);
            return pvVar3;
          }
          return block_end + (ulong)(id - uVar2) * this->m_sizeof_element;
        }
      }
      block_end = _i1;
    }
  }
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePool::ElementFromId(
  size_t id_offset,
  unsigned int id
  ) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int i0, i1;
  size_t count;
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return nullptr;
  }
  if (id_offset + sizeof(id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return nullptr;
  }

  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    i1 = *((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));
    if (i1 < id)
      continue;

    if ( id == i1 )
      return (void*)(block_end-m_sizeof_element);

    i0 = *((const unsigned int*)(block + id_offset));
    if (id < i0)
      continue;

    if ( id == i0 )
      return (void*)(block);

    count = (block_end - block)/m_sizeof_element;
    if (i1 - i0 + 1 == count)
    {
      return (void*)(block + ((id-i0)*m_sizeof_element));
    }

    return (void*)ON_BinarySearchArrayForUnsingedInt(id, block, count, m_sizeof_element, id_offset );
  }

  return nullptr;
}